

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

QList<int> * __thiscall
QDockAreaLayoutInfo::gapIndex
          (QList<int> *__return_storage_ptr__,QDockAreaLayoutInfo *this,QPoint *_pos,
          bool nestingEnabled,TabMode tabMode)

{
  Orientation OVar1;
  QDockAreaLayoutItem *pQVar2;
  QDockAreaLayoutInfo *this_00;
  bool bVar3;
  char cVar4;
  QPoint *pQVar5;
  int iVar6;
  ulong uVar7;
  uint t;
  parameter_type t_00;
  int iVar8;
  int iVar9;
  long lVar10;
  uint t_01;
  int iVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  QRect QVar13;
  undefined1 local_58 [8];
  int local_50;
  int local_4c;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (int *)0x0;
  if (this->tabbed == true) {
    QVar13 = tabContentRect(this);
    t = 0;
  }
  else {
    pQVar5 = (QPoint *)&_pos->yp;
    if (this->o == Horizontal) {
      pQVar5 = _pos;
    }
    iVar6 = (pQVar5->xp).m_i;
    uVar7 = 0xffffffffffffffff;
    lVar10 = 0;
    for (uVar12 = 0; t_01 = (uint)uVar7, uVar12 < (ulong)(this->item_list).d.size;
        uVar12 = uVar12 + 1) {
      pQVar2 = (this->item_list).d.ptr;
      bVar3 = QDockAreaLayoutItem::skip((QDockAreaLayoutItem *)((long)&pQVar2->widgetItem + lVar10))
      ;
      if (!bVar3) {
        t_01 = (uint)uVar12;
        if (iVar6 <= *(int *)((long)&pQVar2->size + lVar10) + *(int *)((long)&pQVar2->pos + lVar10))
        {
          this_00 = *(QDockAreaLayoutInfo **)((long)&pQVar2->subinfo + lVar10);
          if ((this_00 == (QDockAreaLayoutInfo *)0x0) || (this_00->tabbed == true)) {
            QVar13 = itemRect(this,t_01,false);
            t = t_01;
            goto LAB_003c8f79;
          }
          gapIndex((QList<int> *)local_58,this_00,_pos,nestingEnabled,tabMode);
          QArrayDataPointer<int>::operator=
                    (&__return_storage_ptr__->d,(QArrayDataPointer<int> *)local_58);
          QArrayDataPointer<int>::~QArrayDataPointer((QArrayDataPointer<int> *)local_58);
          QList<int>::prepend(__return_storage_ptr__,t_01);
          goto LAB_003c8df7;
        }
        uVar7 = uVar12 & 0xffffffff;
      }
      lVar10 = lVar10 + 0x28;
    }
    t = 0;
    QVar13 = (QRect)(ZEXT816(0xffffffffffffffff) << 0x40);
LAB_003c8f79:
    if ((QVar13.x1.m_i.m_i + -1 == QVar13.x2.m_i.m_i) &&
       (QVar13.y1.m_i.m_i + -1 == QVar13.y2.m_i.m_i)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        QList<int>::append(__return_storage_ptr__,t_01 + 1);
        return __return_storage_ptr__;
      }
      goto LAB_003c9157;
    }
  }
  if (tabMode == ForceTabs) {
LAB_003c8de3:
    QList<int>::append(__return_storage_ptr__,~t);
LAB_003c8ded:
    t_00 = 0;
LAB_003c8df2:
    QList<int>::append(__return_storage_ptr__,t_00);
  }
  else {
    OVar1 = this->o;
    iVar6 = (_pos->xp).m_i - QVar13.x1.m_i;
    iVar11 = (_pos->yp).m_i - QVar13.y1.m_i;
    local_40 = CONCAT44(iVar11,iVar6);
    iVar9 = (QVar13.x2.m_i.m_i - QVar13.x1.m_i) + 1;
    iVar8 = (QVar13.y2.m_i.m_i - QVar13.y1.m_i) + 1;
    if (tabMode != NoTabs) {
      if (nestingEnabled) {
        local_58._0_4_ = iVar9 / 6;
        local_58._4_4_ = iVar8 / 6;
        local_50 = local_58._0_4_ + -1 + (iVar9 * 2) / 3;
        local_4c = (iVar8 * 2) / 3 + local_58._4_4_ + -1;
        cVar4 = QRect::contains((QPoint *)local_58,SUB81(&local_40,0));
        if (cVar4 == '\0') goto LAB_003c8fdf;
      }
      else if (OVar1 == Horizontal) {
        if ((iVar6 <= iVar9 / 6) || ((iVar9 * 5) / 6 <= iVar6)) goto LAB_003c905e;
      }
      else if ((iVar11 <= iVar8 / 6) || ((iVar8 * 5) / 6 <= iVar11)) goto LAB_003c90c1;
      goto LAB_003c8de3;
    }
    if (!nestingEnabled) {
      if (OVar1 == Horizontal) {
LAB_003c905e:
        if (iVar6 < iVar9 / 2) {
LAB_003c906b:
          OVar1 = this->o;
          QList<int>::append(__return_storage_ptr__,t);
          if (OVar1 != Horizontal) goto LAB_003c8ded;
          goto LAB_003c8df7;
        }
LAB_003c9090:
        if (this->o != Horizontal) goto LAB_003c90fb;
LAB_003c9097:
        t_00 = t + 1;
      }
      else {
LAB_003c90c1:
        if (iVar11 < iVar8 / 2) goto LAB_003c90cf;
LAB_003c90f4:
        if (this->o != Horizontal) goto LAB_003c9097;
LAB_003c90fb:
        QList<int>::append(__return_storage_ptr__,t);
        t_00 = 1;
      }
      goto LAB_003c8df2;
    }
LAB_003c8fdf:
    if (OVar1 == Horizontal) {
      if (iVar6 < iVar9 / 3) goto LAB_003c906b;
      if ((iVar9 * 2) / 3 < iVar6) goto LAB_003c9090;
      goto LAB_003c90c1;
    }
    if (iVar8 / 3 <= iVar11) {
      if (iVar11 <= (iVar8 * 2) / 3) goto LAB_003c905e;
      goto LAB_003c90f4;
    }
LAB_003c90cf:
    OVar1 = this->o;
    QList<int>::append(__return_storage_ptr__,t);
    if (OVar1 == Horizontal) goto LAB_003c8ded;
  }
LAB_003c8df7:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_003c9157:
  __stack_chk_fail();
}

Assistant:

QList<int> QDockAreaLayoutInfo::gapIndex(const QPoint& _pos,
                        bool nestingEnabled, TabMode tabMode) const
{
    QList<int> result;
    QRect item_rect;
    int item_index = 0;

#if QT_CONFIG(tabbar)
    if (tabbed) {
        item_rect = tabContentRect();
    } else
#endif
    {
        int pos = pick(o, _pos);

        int last = -1;
        for (int i = 0; i < item_list.size(); ++i) {
            const QDockAreaLayoutItem &item = item_list.at(i);
            if (item.skip())
                continue;

            last = i;

            if (item.pos + item.size < pos)
                continue;

            if (item.subinfo != nullptr
#if QT_CONFIG(tabbar)
                && !item.subinfo->tabbed
#endif
                ) {
                result = item.subinfo->gapIndex(_pos, nestingEnabled,
                                                    tabMode);
                result.prepend(i);
                return result;
            }

            item_rect = itemRect(i);
            item_index = i;
            break;
        }

        if (item_rect.isNull()) {
            result.append(last + 1);
            return result;
        }
    }

    Q_ASSERT(!item_rect.isNull());

    QInternal::DockPosition dock_pos
        = dockPosHelper(item_rect, _pos, o, nestingEnabled, tabMode);

    switch (dock_pos) {
        case QInternal::LeftDock:
            if (o == Qt::Horizontal)
                result << item_index;
            else
                result << item_index << 0; // this subinfo doesn't exist yet, but insertGap()
                                           // handles this by inserting it
            break;
        case QInternal::RightDock:
            if (o == Qt::Horizontal)
                result << item_index + 1;
            else
                result << item_index << 1;
            break;
        case QInternal::TopDock:
            if (o == Qt::Horizontal)
                result << item_index << 0;
            else
                result << item_index;
            break;
        case QInternal::BottomDock:
            if (o == Qt::Horizontal)
                result << item_index << 1;
            else
                result << item_index + 1;
            break;
        case  QInternal::DockCount:
            result << (-item_index - 1) << 0;   // negative item_index means "on top of"
                                                // -item_index - 1, insertGap()
                                                // will insert a tabbed subinfo
            break;
        default:
            break;
    }

    return result;
}